

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void ixmlNode_free(IXML_Node *nodeptr)

{
  Nodeptr p_Var1;
  IXML_BeforeFreeNode_t p_Var2;
  IXML_BeforeFreeNode_t hndlr;
  IXML_Node *next_attr;
  IXML_Node *curr_attr;
  IXML_Node *next_child;
  IXML_Node *prev_child;
  IXML_Node *curr_child;
  IXML_Node *nodeptr_local;
  
  if (nodeptr != (IXML_Node *)0x0) {
    p_Var2 = Parser_getBeforeFree();
    curr_attr = nodeptr->firstChild;
    next_child = nodeptr;
    do {
      prev_child = curr_attr;
      do {
        for (; prev_child != (IXML_Node *)0x0; prev_child = prev_child->firstChild) {
          next_child = prev_child;
        }
        for (prev_child = next_child; prev_child != (IXML_Node *)0x0;
            prev_child = prev_child->nextSibling) {
          next_child = prev_child;
        }
        prev_child = next_child;
      } while (next_child->firstChild != (Nodeptr)0x0);
      next_attr = next_child->firstAttr;
      while (next_attr != (IXML_Node *)0x0) {
        p_Var1 = next_attr->nextSibling;
        ixmlNode_freeSingleNode(next_attr);
        next_attr = p_Var1;
      }
      next_child->firstAttr = (Nodeptr)0x0;
      curr_attr = (IXML_Node *)0x0;
      if (next_child != nodeptr) {
        if (next_child->prevSibling == (Nodeptr)0x0) {
          curr_attr = next_child->parentNode;
          curr_attr->firstChild = (Nodeptr)0x0;
        }
        else {
          curr_attr = next_child->prevSibling;
          curr_attr->nextSibling = (Nodeptr)0x0;
        }
      }
      if (p_Var2 != (IXML_BeforeFreeNode_t)0x0) {
        (*p_Var2)(next_child);
      }
      ixmlNode_freeSingleNode(next_child);
    } while (next_child != nodeptr);
  }
  return;
}

Assistant:

void ixmlNode_free(IXML_Node *nodeptr)
{
	IXML_Node *curr_child;
	IXML_Node *prev_child;
	IXML_Node *next_child;
	IXML_Node *curr_attr;
	IXML_Node *next_attr;

	if (nodeptr) {
#ifdef IXML_HAVE_SCRIPTSUPPORT
		IXML_BeforeFreeNode_t hndlr = Parser_getBeforeFree();
#endif
		prev_child = nodeptr;
		next_child = nodeptr->firstChild;
		do {
			curr_child = next_child;
			do {
				while (curr_child) {
					prev_child = curr_child;
					curr_child = curr_child->firstChild;
				}
				curr_child = prev_child;
				while (curr_child) {
					prev_child = curr_child;
					curr_child = curr_child->nextSibling;
				}
				curr_child = prev_child;
				next_child = curr_child->firstChild;
			} while (next_child);
			/* current is now the last sibling of the last child. */
			/* Delete the attribute nodes of this child */
			/* Attribute nodes only have siblings. */
			curr_attr = curr_child->firstAttr;
			while (curr_attr) {
				next_attr = curr_attr->nextSibling;
				ixmlNode_freeSingleNode(curr_attr);
				curr_attr = next_attr;
			}
			curr_child->firstAttr = 0;
			/* Return */
			if (curr_child != nodeptr) {
				if (curr_child->prevSibling) {
					next_child = curr_child->prevSibling;
					next_child->nextSibling = 0;
				} else {
					next_child = curr_child->parentNode;
					next_child->firstChild = 0;
				}
			}
#ifdef IXML_HAVE_SCRIPTSUPPORT
			if (hndlr) {
				hndlr(curr_child);
			}
#endif
			ixmlNode_freeSingleNode(curr_child);
		} while (curr_child != nodeptr);
	}
}